

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O3

void __thiscall PrimitiveDisplayer::drawSquare(PrimitiveDisplayer *this,GLfloat pixelSize)

{
  undefined8 local_38;
  GLfloat vertices [8];
  
  vertices[7] = pixelSize;
  glShadeModel(0x1d00);
  local_38 = 0;
  vertices[0] = vertices[7];
  vertices[1] = 0.0;
  vertices[2] = vertices[7];
  vertices[3] = vertices[7];
  vertices[4] = 0.0;
  vertices[5] = vertices[7];
  glEnableClientState(0x8074);
  glVertexPointer(2,0x1406,0,&local_38);
  glDrawArrays(7,0,4);
  glDisableClientState(0x8074);
  return;
}

Assistant:

void PrimitiveDisplayer::drawSquare(GLfloat pixelSize) {
    glShadeModel(GL_FLAT);
    GLfloat vertices[8] = {
        0           ,0
        ,pixelSize  ,0
        ,pixelSize  ,pixelSize
        ,0          ,pixelSize
    };
	glEnableClientState(GL_VERTEX_ARRAY);
	glVertexPointer(2, GL_FLOAT, 0, vertices);
	glDrawArrays(GL_QUADS, 0, 4);
	glDisableClientState(GL_VERTEX_ARRAY);
}